

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ReadObject(JSContext *ctx,uint8_t *buf,size_t buf_len,int flags)

{
  int iVar1;
  uint in_ECX;
  uint uVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  JSValue JVar3;
  BCReaderState *s;
  BCReaderState ss;
  JSValue obj;
  BCReaderState *in_stack_000000b0;
  JSValueUnion in_stack_ffffffffffffff60;
  int64_t local_98;
  uint uStack_8c;
  BCReaderState *in_stack_ffffffffffffff78;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  undefined4 local_58;
  uint local_44;
  uint local_2c;
  long local_28;
  long local_20;
  long local_18;
  JSValueUnion local_10;
  int64_t local_8;
  
  *(short *)(in_RDI + 0x30) = *(short *)(in_RDI + 0x30) + 1;
  *(int *)(in_RDI + 0x34) = *(int *)(in_RDI + 0x34) + (int)in_RDX;
  local_2c = in_ECX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  memset(&local_78,0,0x48);
  local_78 = local_18;
  local_70 = local_20;
  local_60 = local_20 + local_28;
  local_68 = local_20;
  uVar2 = (uint)((local_2c & 1) != 0) << 8 | (uint)((local_2c & 2) != 0) << 0x10 |
          (uint)((local_2c & 4) != 0);
  local_44 = uVar2 | (uint)((local_2c & 8) != 0) << 0x18;
  if ((int)(uVar2 << 0x10) >> 0x18 == 0) {
    local_58 = 1;
  }
  else {
    local_58 = 0xd2;
  }
  iVar1 = JS_ReadObjectAtoms(in_stack_ffffffffffffff78);
  if (iVar1 == 0) {
    JVar3 = JS_ReadObjectRec(in_stack_000000b0);
    local_10 = JVar3.u;
    local_98 = JVar3.tag;
    local_8 = local_98;
    in_stack_ffffffffffffff60 = local_10;
  }
  else {
    local_10.ptr = (void *)((ulong)uStack_8c << 0x20);
    local_8 = 6;
  }
  bc_reader_free((BCReaderState *)in_stack_ffffffffffffff60.ptr);
  JVar3.tag = local_8;
  JVar3.u.ptr = local_10.ptr;
  return JVar3;
}

Assistant:

JSValue JS_ReadObject(JSContext *ctx, const uint8_t *buf, size_t buf_len,
                       int flags)
{
    BCReaderState ss, *s = &ss;
    JSValue obj;

    ctx->binary_object_count += 1;
    ctx->binary_object_size += buf_len;

    memset(s, 0, sizeof(*s));
    s->ctx = ctx;
    s->buf_start = buf;
    s->buf_end = buf + buf_len;
    s->ptr = buf;
    s->allow_bytecode = ((flags & JS_READ_OBJ_BYTECODE) != 0);
    s->is_rom_data = ((flags & JS_READ_OBJ_ROM_DATA) != 0);
    s->allow_sab = ((flags & JS_READ_OBJ_SAB) != 0);
    s->allow_reference = ((flags & JS_READ_OBJ_REFERENCE) != 0);
    if (s->allow_bytecode)
        s->first_atom = JS_ATOM_END;
    else
        s->first_atom = 1;
    if (JS_ReadObjectAtoms(s)) {
        obj = JS_EXCEPTION;
    } else {
        obj = JS_ReadObjectRec(s);
    }
    bc_reader_free(s);
    return obj;
}